

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

GeneratorNode * __thiscall
kratos::GeneratorGraph::add_node(GeneratorGraph *this,Generator *generator)

{
  iterator iVar1;
  mapped_type *pmVar2;
  GeneratorException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view format_str;
  format_args args;
  initializer_list<kratos::IRNode_*> __l;
  undefined1 local_98 [8];
  GeneratorNode node;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_48;
  Generator *local_30;
  Generator *generator_local;
  
  local_30 = generator;
  iVar1 = std::
          _Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_30);
  if (iVar1.
      super__Node_iterator_base<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_false>.
      _M_cur == (__node_type *)0x0) {
    node.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&node.children
    ;
    local_98 = (undefined1  [8])0x0;
    node.children._M_t._M_impl._0_4_ = 0;
    node.children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    node.children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    node.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    node.parent = (GeneratorNode *)local_30;
    node.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         node.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::
    _Hashtable<kratos::Generator*,std::pair<kratos::Generator*const,kratos::GeneratorNode>,std::allocator<std::pair<kratos::Generator*const,kratos::GeneratorNode>>,std::__detail::_Select1st,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<kratos::Generator*&,kratos::GeneratorNode&>
              ((_Hashtable<kratos::Generator*,std::pair<kratos::Generator*const,kratos::GeneratorNode>,std::allocator<std::pair<kratos::Generator*const,kratos::GeneratorNode>>,std::__detail::_Select1st,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)this,&local_30,local_98);
    pmVar2 = std::__detail::
             _Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this,&local_30);
    std::
    _Rb_tree<kratos::Generator_*,_kratos::Generator_*,_std::_Identity<kratos::Generator_*>,_std::less<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
    ::~_Rb_tree((_Rb_tree<kratos::Generator_*,_kratos::Generator_*,_std::_Identity<kratos::Generator_*>,_std::less<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
                 *)&node.generator);
    return pmVar2;
  }
  this_00 = (GeneratorException *)__cxa_allocate_exception(0x10);
  local_48.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(local_30->instance_name)._M_dataplus._M_p;
  local_48.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(local_30->instance_name)._M_string_length;
  bVar3 = fmt::v7::to_string_view<char,_0>("{0} was used in another generator!");
  format_str.data_ = (char *)bVar3.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_48;
  fmt::v7::detail::vformat_abi_cxx11_((string *)local_98,(detail *)bVar3.data_,format_str,args);
  node.children._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_30;
  std::__detail::
  _Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  ::at((_Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
        *)this,&local_30);
  __l._M_len = 2;
  __l._M_array = (iterator)&node.children._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
            (&local_48,__l,(allocator_type *)((long)&generator_local + 7));
  GeneratorException::GeneratorException(this_00,(string *)local_98,&local_48);
  __cxa_throw(this_00,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

GeneratorNode *GeneratorGraph::add_node(Generator *generator) {
    if (nodes_.find(generator) != nodes_.end()) {
        throw GeneratorException(
            ::format("{0} was used in another generator!", generator->instance_name),
            {generator, nodes_.at(generator).generator});
    }
    GeneratorNode node;
    node.generator = generator;
    nodes_.emplace(generator, node);
    // return the pointer hosted by the nodes_
    return &nodes_.at(generator);
}